

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::update_user_agent(session_impl *this)

{
  pointer pcVar1;
  string *psVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  string agent;
  undefined1 local_59;
  long *local_58;
  long local_50;
  long local_48 [2];
  string local_38;
  
  psVar2 = session_settings::get_str_abi_cxx11_(&this->m_settings,0);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_58 = local_48;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar2->_M_string_length);
  _Var3._M_current = (char *)local_58;
  while( true ) {
    local_59 = 10;
    _Var3 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var3._M_current,(char *)((long)local_58 + local_50),&local_59);
    if (_Var3._M_current == (char *)((long)local_58 + local_50)) break;
    *_Var3._M_current = ' ';
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_38);
  session_settings::set_str(&this->m_settings,0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void session_impl::update_user_agent()
	{
		// replace all occurrences of '\n' with ' '.
		std::string agent = m_settings.get_str(settings_pack::user_agent);
		std::string::iterator i = agent.begin();
		while ((i = std::find(i, agent.end(), '\n'))
			!= agent.end())
			*i = ' ';
		m_settings.set_str(settings_pack::user_agent, agent);
	}